

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor.hpp
# Opt level: O2

ostream * operator<<(ostream *stream,taylor<double,_2,_12> *t)

{
  double *pdVar1;
  int i;
  int i_00;
  
  std::operator<<(stream,"{");
  std::ostream::_M_insert<double>((t->super_polynomial<double,_2,_12>).c[0]);
  for (i_00 = 1; i_00 != 0x5b; i_00 = i_00 + 1) {
    std::operator<<(stream,", ");
    pdVar1 = taylor<double,_2,_12>::operator[](t,i_00);
    std::ostream::_M_insert<double>(*pdVar1);
  }
  std::operator<<(stream,"}");
  return stream;
}

Assistant:

static std::ostream & operator<<(std::ostream & stream,
                                 const taylor<num, Nvar, Ndeg> & t) {
  stream << "{" << t[0];
  for (int i = 1; i < t.size; i++)
    stream << ", " << t[i];
  stream << "}";
  return stream;
}